

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode curl_easy_pause(Curl_easy *data,int action)

{
  connectdata *conn_00;
  size_t sVar1;
  uint uVar2;
  char *ptr;
  size_t len;
  uint uVar3;
  uint uVar4;
  Curl_easy *local_c8;
  Curl_easy *saved_data;
  connectdata *conn;
  tempbuf writebuf [3];
  uint local_38;
  uint count;
  uint i;
  int newstate;
  int oldstate;
  CURLcode result;
  SingleRequest *k;
  int action_local;
  Curl_easy *data_local;
  
  newstate = 0;
  if (((data == (Curl_easy *)0x0) || (data->magic != 0xc0dedbad)) ||
     (data->conn == (connectdata *)0x0)) {
    data_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    uVar3 = 0;
    if ((action & 1U) != 0) {
      uVar3 = 0x10;
    }
    uVar4 = 0;
    if ((action & 4U) != 0) {
      uVar4 = 0x20;
    }
    uVar2 = (data->req).keepon & 0xffffffcfU | uVar3 | uVar4;
    if ((uVar3 | uVar4) == ((data->req).keepon & 0x30U)) {
      data_local._4_4_ = CURLE_OK;
    }
    else {
      if (((((data->req).keepon & (uVar2 ^ 0xffffffff) & 0x20) != 0) &&
          ((data->mstate == CURLM_STATE_PERFORM || (data->mstate == CURLM_STATE_TOOFAST)))) &&
         ((data->state).fread_func == Curl_mime_read)) {
        Curl_mime_unpause((curl_mimepart *)(data->state).in);
      }
      (data->req).keepon = uVar2;
      if ((uVar3 == 0) && ((data->state).tempcount != 0)) {
        writebuf[2]._36_4_ = (data->state).tempcount;
        conn_00 = data->conn;
        local_c8 = (Curl_easy *)0x0;
        for (local_38 = 0; local_38 < (data->state).tempcount; local_38 = local_38 + 1) {
          memcpy(&writebuf[(ulong)local_38 - 1].type,(data->state).tempwrite + local_38,0x28);
          Curl_dyn_init(&(data->state).tempwrite[local_38].b,0x4000000);
        }
        (data->state).tempcount = 0;
        if (conn_00->data != data) {
          local_c8 = conn_00->data;
          conn_00->data = data;
        }
        for (local_38 = 0; local_38 < (uint)writebuf[2]._36_4_; local_38 = local_38 + 1) {
          if (newstate == 0) {
            sVar1 = writebuf[local_38].b.toobig;
            ptr = Curl_dyn_ptr((dynbuf *)&writebuf[(ulong)local_38 - 1].type);
            len = Curl_dyn_len((dynbuf *)&writebuf[(ulong)local_38 - 1].type);
            newstate = Curl_client_write(conn_00,(int)sVar1,ptr,len);
          }
          Curl_dyn_free((dynbuf *)&writebuf[(ulong)local_38 - 1].type);
        }
        if (local_c8 != (Curl_easy *)0x0) {
          conn_00->data = local_c8;
        }
        if (newstate != 0) {
          return newstate;
        }
      }
      if ((uVar3 | uVar4) != 0x30) {
        Curl_expire(data,0,EXPIRE_RUN_NOW);
        if ((data->state).tempcount == 0) {
          data->conn->cselect_bits = 3;
        }
        if (data->multi != (Curl_multi *)0x0) {
          Curl_update_timer(data->multi);
        }
      }
      if ((*(ushort *)&(data->state).field_0x600 >> 0xc & 1) == 0) {
        Curl_updatesocket(data);
      }
      data_local._4_4_ = newstate;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode curl_easy_pause(struct Curl_easy *data, int action)
{
  struct SingleRequest *k;
  CURLcode result = CURLE_OK;
  int oldstate;
  int newstate;

  if(!GOOD_EASY_HANDLE(data) || !data->conn)
    /* crazy input, don't continue */
    return CURLE_BAD_FUNCTION_ARGUMENT;

  k = &data->req;
  oldstate = k->keepon & (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE);

  /* first switch off both pause bits then set the new pause bits */
  newstate = (k->keepon &~ (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE)) |
    ((action & CURLPAUSE_RECV)?KEEP_RECV_PAUSE:0) |
    ((action & CURLPAUSE_SEND)?KEEP_SEND_PAUSE:0);

  if((newstate & (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE)) == oldstate) {
    /* Not changing any pause state, return */
    DEBUGF(infof(data, "pause: no change, early return\n"));
    return CURLE_OK;
  }

  /* Unpause parts in active mime tree. */
  if((k->keepon & ~newstate & KEEP_SEND_PAUSE) &&
     (data->mstate == CURLM_STATE_PERFORM ||
      data->mstate == CURLM_STATE_TOOFAST) &&
     data->state.fread_func == (curl_read_callback) Curl_mime_read) {
    Curl_mime_unpause(data->state.in);
  }

  /* put it back in the keepon */
  k->keepon = newstate;

  if(!(newstate & KEEP_RECV_PAUSE)) {
    Curl_http2_stream_pause(data, FALSE);

    if(data->state.tempcount) {
      /* there are buffers for sending that can be delivered as the receive
         pausing is lifted! */
      unsigned int i;
      unsigned int count = data->state.tempcount;
      struct tempbuf writebuf[3]; /* there can only be three */
      struct connectdata *conn = data->conn;
      struct Curl_easy *saved_data = NULL;

      /* copy the structs to allow for immediate re-pausing */
      for(i = 0; i < data->state.tempcount; i++) {
        writebuf[i] = data->state.tempwrite[i];
        Curl_dyn_init(&data->state.tempwrite[i].b, DYN_PAUSE_BUFFER);
      }
      data->state.tempcount = 0;

      /* set the connection's current owner */
      if(conn->data != data) {
        saved_data = conn->data;
        conn->data = data;
      }

      for(i = 0; i < count; i++) {
        /* even if one function returns error, this loops through and frees
           all buffers */
        if(!result)
          result = Curl_client_write(conn, writebuf[i].type,
                                     Curl_dyn_ptr(&writebuf[i].b),
                                     Curl_dyn_len(&writebuf[i].b));
        Curl_dyn_free(&writebuf[i].b);
      }

      /* recover previous owner of the connection */
      if(saved_data)
        conn->data = saved_data;

      if(result)
        return result;
    }
  }

  /* if there's no error and we're not pausing both directions, we want
     to have this handle checked soon */
  if((newstate & (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) !=
     (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) {
    Curl_expire(data, 0, EXPIRE_RUN_NOW); /* get this handle going again */

    if(!data->state.tempcount)
      /* if not pausing again, force a recv/send check of this connection as
         the data might've been read off the socket already */
      data->conn->cselect_bits = CURL_CSELECT_IN | CURL_CSELECT_OUT;
    if(data->multi)
      Curl_update_timer(data->multi);
  }

  if(!data->state.done)
    /* This transfer may have been moved in or out of the bundle, update the
       corresponding socket callback, if used */
    Curl_updatesocket(data);

  return result;
}